

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void crec_finalizer(jit_State *J,TRef trcd,cTValue *fin)

{
  IRRef1 IVar1;
  TRef TVar2;
  long in_RDX;
  uint in_ESI;
  jit_State *in_RDI;
  TRef trhi;
  TRef trlo;
  TraceError in_stack_ffffffffffffff3c;
  jit_State *in_stack_ffffffffffffff40;
  jit_State *pjVar3;
  undefined4 in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff4c;
  undefined2 in_stack_ffffffffffffff4e;
  jit_State *in_stack_ffffffffffffff50;
  IRType t;
  undefined6 in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff5e;
  IRRef1 IVar4;
  jit_State *in_stack_ffffffffffffff60;
  
  TVar2 = lj_ir_call(in_RDI,IRCALL_lj_cdata_setfin,(ulong)in_ESI);
  IVar1 = (IRRef1)TVar2;
  TVar2 = lj_ir_kint(in_stack_ffffffffffffff50,
                     CONCAT22(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff4c));
  (in_RDI->fold).ins.field_0.ot = 0x2805;
  (in_RDI->fold).ins.field_0.op1 = IVar1;
  (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar2;
  TVar2 = lj_opt_fold((jit_State *)
                      CONCAT26(in_stack_ffffffffffffff4e,
                               CONCAT24(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)));
  t = (IRType)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  IVar4 = (IRRef1)TVar2;
  if (*(int *)(in_RDX + 4) == -9) {
    pjVar3 = in_RDI;
    TVar2 = lj_ir_kgc(in_RDI,(GCobj *)CONCAT26(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58),
                      t);
    (pjVar3->fold).ins.field_0.ot = 0x4b05;
    (pjVar3->fold).ins.field_0.op1 = IVar1;
    (pjVar3->fold).ins.field_0.op2 = (IRRef1)TVar2;
    lj_opt_fold((jit_State *)
                CONCAT26(in_stack_ffffffffffffff4e,
                         CONCAT24(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)));
    TVar2 = lj_ir_kint(in_stack_ffffffffffffff50,
                       CONCAT22(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff4c));
    (in_RDI->fold).ins.field_0.ot = 0x4b13;
    (in_RDI->fold).ins.field_0.op1 = IVar4;
    (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar2;
    lj_opt_fold((jit_State *)
                CONCAT26(in_stack_ffffffffffffff4e,
                         CONCAT24(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)));
  }
  else {
    if (*(int *)(in_RDX + 4) != -0xb) {
      lj_trace_err(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    }
    pjVar3 = in_RDI;
    TVar2 = lj_ir_kgc(in_stack_ffffffffffffff60,
                      (GCobj *)CONCAT26(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58),t);
    (pjVar3->fold).ins.field_0.ot = 0x4b05;
    (pjVar3->fold).ins.field_0.op1 = IVar1;
    (pjVar3->fold).ins.field_0.op2 = (IRRef1)TVar2;
    lj_opt_fold((jit_State *)
                CONCAT26(IVar1,CONCAT24(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)));
    pjVar3 = in_RDI;
    TVar2 = lj_ir_kint(in_RDI,CONCAT22(IVar1,in_stack_ffffffffffffff4c));
    (pjVar3->fold).ins.field_0.ot = 0x4b13;
    (pjVar3->fold).ins.field_0.op1 = IVar4;
    (pjVar3->fold).ins.field_0.op2 = (IRRef1)TVar2;
    lj_opt_fold((jit_State *)
                CONCAT26(IVar1,CONCAT24(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)));
  }
  in_RDI->needsnap = '\x01';
  return;
}

Assistant:

static void crec_finalizer(jit_State *J, TRef trcd, cTValue *fin)
{
  TRef trlo = lj_ir_call(J, IRCALL_lj_cdata_setfin, trcd);
  TRef trhi = emitir(IRT(IR_ADD, IRT_P32), trlo, lj_ir_kint(J, 4));
  if (LJ_BE) { TRef tmp = trlo; trlo = trhi; trhi = tmp; }
  if (tvisfunc(fin)) {
    emitir(IRT(IR_XSTORE, IRT_P32), trlo, lj_ir_kfunc(J, funcV(fin)));
    emitir(IRTI(IR_XSTORE), trhi, lj_ir_kint(J, LJ_TFUNC));
  } else if (tviscdata(fin)) {
    emitir(IRT(IR_XSTORE, IRT_P32), trlo,
	   lj_ir_kgc(J, obj2gco(cdataV(fin)), IRT_CDATA));
    emitir(IRTI(IR_XSTORE), trhi, lj_ir_kint(J, LJ_TCDATA));
  } else {
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  }
  J->needsnap = 1;
}